

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O2

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  SyntaxNode *args_1;
  SyntaxNode *args_3;
  BinaryPropertyExprSyntax *pBVar1;
  Token local_30;
  
  args_1 = deepClone(*(SyntaxNode **)(__fn + 0x18),(BumpAllocator *)__child_stack);
  local_30 = parsing::Token::deepClone((Token *)(__fn + 0x20),(BumpAllocator *)__child_stack);
  args_3 = deepClone(*(SyntaxNode **)(__fn + 0x30),(BumpAllocator *)__child_stack);
  pBVar1 = BumpAllocator::
           emplace<slang::syntax::BinaryPropertyExprSyntax,slang::syntax::SyntaxKind_const&,slang::syntax::PropertyExprSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&>
                     ((BumpAllocator *)__child_stack,(SyntaxKind *)__fn,(PropertyExprSyntax *)args_1
                      ,&local_30,(PropertyExprSyntax *)args_3);
  return (int)pBVar1;
}

Assistant:

static SyntaxNode* clone(const BinaryPropertyExprSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<BinaryPropertyExprSyntax>(
        node.kind,
        *deepClone<PropertyExprSyntax>(*node.left, alloc),
        node.op.deepClone(alloc),
        *deepClone<PropertyExprSyntax>(*node.right, alloc)
    );
}